

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::TestCase::~TestCase(TestCase *this)

{
  TestCase *in_RDI;
  
  ~TestCase(in_RDI);
  operator_delete(in_RDI,0xf8);
  return;
}

Assistant:

TestCase::~TestCase() {
  // Deletes every Test in the collection.
  ForEach(test_info_list_, internal::Delete<TestInfo>);
}